

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# vktShaderRenderDerivateTests.cpp
# Opt level: O1

TestInstance * __thiscall
vkt::sr::anon_unknown_0::TextureDerivateCase::createInstance
          (TextureDerivateCase *this,Context *context)

{
  deInt32 *pdVar1;
  pointer pPVar2;
  void *pvVar3;
  _func_int **pp_Var4;
  TriangleDerivateCaseInstance *this_00;
  Texture2D *pTVar5;
  TextureFormat this_01;
  int i;
  long lVar6;
  int x;
  deUint32 internalFormat;
  int y;
  float fVar7;
  SharedPtr<vkt::sr::TextureBinding> testTexture;
  MovePtr<tcu::Texture2D,_de::DefaultDeleter<tcu::Texture2D>_> texture;
  PixelBufferAccess level0;
  Vector<float,_4> res;
  Vector<float,_4> res_1;
  undefined1 local_c8 [8];
  undefined8 uStack_c0;
  UniqueBase<tcu::Texture2D,_de::DefaultDeleter<tcu::Texture2D>_> local_b0;
  float local_9c;
  TextureFormat local_98;
  WrapMode WStack_90;
  FilterMode FStack_8c;
  undefined8 local_88;
  bool local_80;
  CompareMode local_7c;
  int iStack_78;
  undefined1 auStack_74 [20];
  DepthStencilMode local_60;
  float local_58 [8];
  Vec4 local_38;
  
  this_00 = (TriangleDerivateCaseInstance *)operator_new(0x228);
  TriangleDerivateCaseInstance::TriangleDerivateCaseInstance
            (this_00,context,
             (this->super_TriangleDerivateCase).super_ShaderRenderCase.m_uniformSetup.
             super_UniqueBase<const_vkt::sr::UniformSetup,_de::DefaultDeleter<const_vkt::sr::UniformSetup>_>
             .m_data.ptr,&(this->super_TriangleDerivateCase).m_definitions,
             &(this->super_TriangleDerivateCase).m_values);
  (this_00->super_ShaderRenderCaseInstance).super_TestInstance._vptr_TestInstance =
       (_func_int **)&PTR__ShaderRenderCaseInstance_00d255c8;
  this_00[1].super_ShaderRenderCaseInstance.super_TestInstance._vptr_TestInstance =
       (_func_int **)&(this->super_TriangleDerivateCase).field_0x13c;
  local_b0.m_data.ptr = (Texture2D *)0x0;
  internalFormat = 0x881a;
  if (this_00->m_definitions->precision == PRECISION_HIGHP) {
    internalFormat = 0x8814;
  }
  local_c8 = (undefined1  [8])glu::mapGLInternalFormat(internalFormat);
  pTVar5 = (Texture2D *)operator_new(0x50);
  tcu::Texture2D::Texture2D(pTVar5,(TextureFormat *)local_c8,99,0x85);
  local_98.order = CLAMP_TO_EDGE;
  local_98.type = CLAMP_TO_EDGE;
  if (local_b0.m_data.ptr != pTVar5) {
    de::details::UniqueBase<tcu::Texture2D,_de::DefaultDeleter<tcu::Texture2D>_>::reset(&local_b0);
    local_b0.m_data.ptr = pTVar5;
  }
  de::details::UniqueBase<tcu::Texture2D,_de::DefaultDeleter<tcu::Texture2D>_>::reset
            ((UniqueBase<tcu::Texture2D,_de::DefaultDeleter<tcu::Texture2D>_> *)&local_98);
  tcu::Texture2D::allocLevel(local_b0.m_data.ptr,0);
  pPVar2 = ((local_b0.m_data.ptr)->super_TextureLevelPyramid).m_access.
           super__Vector_base<tcu::PixelBufferAccess,_std::allocator<tcu::PixelBufferAccess>_>.
           _M_impl.super__Vector_impl_data._M_start;
  local_98 = (pPVar2->super_ConstPixelBufferAccess).m_format;
  lVar6 = 2;
  do {
    (&((Sampler *)&local_98)->wrapS)[lVar6] =
         (pPVar2->super_ConstPixelBufferAccess).m_size.m_data[lVar6 + -2];
    lVar6 = lVar6 + 1;
  } while (lVar6 != 5);
  lVar6 = 5;
  do {
    (&((Sampler *)&local_98)->wrapS)[lVar6] =
         (pPVar2->super_ConstPixelBufferAccess).m_size.m_data[lVar6 + -2];
    lVar6 = lVar6 + 1;
  } while (lVar6 != 8);
  pvVar3 = (pPVar2->super_ConstPixelBufferAccess).m_data;
  iStack_78 = (int)pvVar3;
  auStack_74._0_4_ = (undefined4)((ulong)pvVar3 >> 0x20);
  if (0 < (int)FStack_8c) {
    y = 0;
    do {
      if (0 < (int)WStack_90) {
        local_9c = (float)y + 0.5;
        x = 0;
        do {
          local_c8._0_4_ = ((float)x + 0.5) / (float)(int)WStack_90;
          fVar7 = ((float)local_c8._0_4_ + local_9c / (float)(int)FStack_8c) * 0.5;
          local_c8._4_4_ = local_9c / (float)(int)FStack_8c;
          uStack_c0 = (SharedPtrStateBase *)CONCAT44(1.0 - fVar7,fVar7);
          pp_Var4 = this_00[1].super_ShaderRenderCaseInstance.super_TestInstance._vptr_TestInstance;
          local_58[0] = 0.0;
          local_58[1] = 0.0;
          local_58[2] = 0.0;
          local_58[3] = 0.0;
          lVar6 = 0;
          do {
            local_58[lVar6] =
                 *(float *)((long)pp_Var4 + lVar6 * 4 + 0x10) -
                 *(float *)((long)pp_Var4 + lVar6 * 4);
            lVar6 = lVar6 + 1;
          } while (lVar6 != 4);
          local_58[4] = 0.0;
          local_58[5] = 0.0;
          local_58[6] = 0.0;
          local_58[7] = 0.0;
          lVar6 = 0;
          do {
            local_58[lVar6 + 4] = local_58[lVar6] * *(float *)(local_c8 + lVar6 * 4);
            lVar6 = lVar6 + 1;
          } while (lVar6 != 4);
          local_38.m_data[0] = 0.0;
          local_38.m_data[1] = 0.0;
          local_38.m_data[2] = 0.0;
          local_38.m_data[3] = 0.0;
          lVar6 = 0;
          do {
            local_38.m_data[lVar6] = *(float *)((long)pp_Var4 + lVar6 * 4) + local_58[lVar6 + 4];
            lVar6 = lVar6 + 1;
          } while (lVar6 != 4);
          tcu::PixelBufferAccess::setPixel((PixelBufferAccess *)&local_98,&local_38,x,y,0);
          x = x + 1;
        } while (x < (int)WStack_90);
      }
      y = y + 1;
    } while (y < (int)FStack_8c);
  }
  this_01 = (TextureFormat)operator_new(0x68);
  pTVar5 = local_b0.m_data.ptr;
  local_b0.m_data.ptr = (Texture2D *)0x0;
  local_88._0_4_ = NEAREST;
  local_88._4_4_ = 0.0;
  local_98.order = CLAMP_TO_EDGE;
  local_98.type = CLAMP_TO_EDGE;
  WStack_90 = CLAMP_TO_EDGE;
  FStack_8c = NEAREST;
  local_80 = true;
  local_60 = MODE_DEPTH;
  local_7c = COMPAREMODE_NONE;
  iStack_78 = 0;
  auStack_74._0_4_ = 0;
  auStack_74._4_4_ = 0;
  auStack_74[8] = 0;
  auStack_74._9_8_ = 0;
  TextureBinding::TextureBinding((TextureBinding *)this_01,pTVar5,(Sampler *)&local_98);
  uStack_c0 = (SharedPtrStateBase *)0x0;
  local_c8 = (undefined1  [8])this_01;
  uStack_c0 = (SharedPtrStateBase *)operator_new(0x20);
  uStack_c0->strongRefCount = 0;
  uStack_c0->weakRefCount = 0;
  uStack_c0->_vptr_SharedPtrStateBase = (_func_int **)&PTR__SharedPtrState_00d25678;
  uStack_c0[1]._vptr_SharedPtrStateBase = (_func_int **)this_01;
  uStack_c0->strongRefCount = 1;
  uStack_c0->weakRefCount = 1;
  std::
  vector<de::SharedPtr<vkt::sr::TextureBinding>,_std::allocator<de::SharedPtr<vkt::sr::TextureBinding>_>_>
  ::push_back(&(this_00->super_ShaderRenderCaseInstance).m_textures,(value_type *)local_c8);
  if (uStack_c0 != (SharedPtrStateBase *)0x0) {
    LOCK();
    pdVar1 = &uStack_c0->strongRefCount;
    *pdVar1 = *pdVar1 + -1;
    UNLOCK();
    if (*pdVar1 == 0) {
      local_c8._0_4_ = R;
      local_c8._4_4_ = SNORM_INT8;
      (*uStack_c0->_vptr_SharedPtrStateBase[2])();
    }
    LOCK();
    pdVar1 = &uStack_c0->weakRefCount;
    *pdVar1 = *pdVar1 + -1;
    UNLOCK();
    if (*pdVar1 == 0) {
      if (uStack_c0 != (SharedPtrStateBase *)0x0) {
        (*uStack_c0->_vptr_SharedPtrStateBase[1])();
      }
      uStack_c0 = (SharedPtrStateBase *)0x0;
    }
  }
  de::details::UniqueBase<tcu::Texture2D,_de::DefaultDeleter<tcu::Texture2D>_>::reset(&local_b0);
  return (TestInstance *)this_00;
}

Assistant:

TestInstance* TextureDerivateCase::createInstance (Context& context) const
{
	DE_ASSERT(m_uniformSetup != DE_NULL);
	return new TextureDerivateCaseInstance(context, *m_uniformSetup, m_definitions, m_values, m_textureValues);
}